

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  bool bVar1;
  ostream *__lhs;
  pointer pMVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Colour colourGuard_1;
  Colour colourGuard;
  size_t N;
  const_iterator itEnd;
  undefined4 in_stack_ffffffffffffff28;
  Code in_stack_ffffffffffffff2c;
  pluralise *in_stack_ffffffffffffff30;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff40;
  AssertionPrinter *this_00;
  undefined1 local_9d [77];
  string local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9d._53_8_ =
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (!bVar1) {
    local_9d._21_8_ =
         clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::cend
                   ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_9d._29_8_ = in_RDI[5];
    local_9d._45_8_ = local_9d._21_8_;
    local_9d._37_8_ =
         std::
         distance<__gnu_cxx::__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>>
                   (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Colour::Colour((Colour *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::operator<<((ostream *)*in_RDI," with ");
    this_00 = (AssertionPrinter *)local_9d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"message",(allocator *)this_00);
    pluralise::pluralise
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),(string *)0x261c6e);
    __lhs = Catch::operator<<((ostream *)in_stack_ffffffffffffff30,
                              (pluralise *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::operator<<(__lhs,':');
    pluralise::~pluralise((pluralise *)0x261ca7);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)local_9d);
    Colour::~Colour((Colour *)0x261cc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)), bVar1) {
      if (((*(byte *)(in_RDI + 6) & 1) == 0) &&
         (pMVar2 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)(in_RDI + 5)), pMVar2->type == Info)) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)(in_RDI + 5));
      }
      else {
        printMessage(this_00);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                          );
        if (bVar1) {
          anon_unknown.dwarf_935d0::dimColour();
          Colour::Colour((Colour *)__lhs,in_stack_ffffffffffffff2c);
          std::operator<<((ostream *)*in_RDI," and");
          Colour::~Colour((Colour *)0x261d5e);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }